

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi__uint16 * stbi__convert_format16(stbi__uint16 *data,int img_n,int req_comp,uint x,uint y)

{
  int iVar1;
  ushort uVar2;
  int iVar3;
  stbi__uint16 *psVar4;
  uint uVar5;
  ushort *puVar6;
  ushort *puVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  stbi__uint16 *psVar11;
  ulong uVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  undefined1 auVar14 [16];
  
  psVar4 = data;
  if (req_comp != img_n) {
    psVar4 = (stbi__uint16 *)malloc((ulong)(req_comp * x * y * 2));
    if (psVar4 == (stbi__uint16 *)0x0) {
      free(data);
      *(char **)(in_FS_OFFSET + -0x10) = "Out of memory";
      psVar4 = (stbi__uint16 *)0x0;
    }
    else {
      if (0 < (int)y) {
        iVar3 = req_comp + img_n * 8;
        iVar1 = x - 1;
        uVar8 = 0;
        uVar12 = 0;
        uVar13 = 0;
        do {
          if (iVar3 - 10U < 0x1a) {
            iVar9 = (int)uVar13 * x;
            puVar7 = data + (uint)(iVar9 * img_n);
            psVar11 = psVar4 + (uint)(iVar9 * req_comp);
            switch(iVar3) {
            case 10:
              if (-1 < iVar1) {
                lVar10 = 0;
                uVar5 = x;
                do {
                  psVar4[uVar12 + lVar10] = *(stbi__uint16 *)((long)data + lVar10 + uVar8 * 2);
                  psVar4[uVar12 + lVar10 + 1] = 0xffff;
                  uVar5 = uVar5 - 1;
                  lVar10 = lVar10 + 2;
                } while (0 < (int)uVar5);
              }
              break;
            case 0xb:
              if (-1 < iVar1) {
                puVar6 = psVar4 + uVar12 + 2;
                uVar5 = x;
                do {
                  uVar2 = *puVar7;
                  *puVar6 = uVar2;
                  puVar6[-1] = uVar2;
                  puVar6[-2] = uVar2;
                  puVar7 = puVar7 + 1;
                  uVar5 = uVar5 - 1;
                  puVar6 = puVar6 + 3;
                } while (0 < (int)uVar5);
              }
              break;
            case 0xc:
              if (-1 < iVar1) {
                lVar10 = 0;
                uVar5 = x;
                do {
                  auVar14._8_8_ = 0;
                  auVar14._0_8_ = (ulong)*(ushort *)((long)data + lVar10 + uVar8 * 2) | 0xffff0000;
                  auVar14 = pshuflw(auVar14,auVar14,0x40);
                  *(long *)(psVar4 + uVar12 + lVar10 * 2) = auVar14._0_8_;
                  uVar5 = uVar5 - 1;
                  lVar10 = lVar10 + 2;
                } while (0 < (int)uVar5);
              }
              break;
            case 0x11:
              if (-1 < iVar1) {
                lVar10 = 0;
                uVar5 = x;
                do {
                  *(stbi__uint16 *)((long)psVar4 + lVar10 + uVar12 * 2) = data[uVar8 + lVar10];
                  uVar5 = uVar5 - 1;
                  lVar10 = lVar10 + 2;
                } while (0 < (int)uVar5);
              }
              break;
            case 0x13:
              if (-1 < iVar1) {
                puVar6 = psVar4 + uVar12 + 2;
                uVar5 = x;
                do {
                  uVar2 = *puVar7;
                  *puVar6 = uVar2;
                  puVar6[-1] = uVar2;
                  puVar6[-2] = uVar2;
                  puVar7 = puVar7 + 2;
                  uVar5 = uVar5 - 1;
                  puVar6 = puVar6 + 3;
                } while (0 < (int)uVar5);
              }
              break;
            case 0x14:
              if (-1 < iVar1) {
                lVar10 = 0;
                uVar5 = x;
                do {
                  auVar14 = ZEXT416(*(uint *)((long)data + lVar10 + uVar8 * 2));
                  auVar14 = pshuflw(auVar14,auVar14,0x40);
                  *(long *)(psVar4 + uVar12 + lVar10) = auVar14._0_8_;
                  uVar5 = uVar5 - 1;
                  lVar10 = lVar10 + 4;
                } while (0 < (int)uVar5);
              }
              break;
            case 0x19:
              uVar5 = x;
              if (-1 < iVar1) {
                do {
                  uVar2 = puVar7[2];
                  *psVar11 = (stbi__uint16)
                             ((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                              (uint)puVar7[1] * 0x96 + (uint)*puVar7 * 0x4d >> 8);
                  puVar7 = puVar7 + 3;
                  psVar11 = psVar11 + 1;
                  uVar5 = uVar5 - 1;
                } while (0 < (int)uVar5);
              }
              break;
            case 0x1a:
              uVar5 = x;
              if (-1 < iVar1) {
                do {
                  uVar2 = puVar7[2];
                  *psVar11 = (stbi__uint16)
                             ((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                              (uint)puVar7[1] * 0x96 + (uint)*puVar7 * 0x4d >> 8);
                  psVar11[1] = 0xffff;
                  puVar7 = puVar7 + 3;
                  psVar11 = psVar11 + 2;
                  uVar5 = uVar5 - 1;
                } while (0 < (int)uVar5);
              }
              break;
            case 0x1c:
              uVar5 = x;
              if (-1 < iVar1) {
                do {
                  *(undefined4 *)psVar11 = *(undefined4 *)puVar7;
                  psVar11[2] = puVar7[2];
                  psVar11[3] = 0xffff;
                  puVar7 = puVar7 + 3;
                  psVar11 = psVar11 + 4;
                  uVar5 = uVar5 - 1;
                } while (0 < (int)uVar5);
              }
              break;
            case 0x21:
              if (-1 < iVar1) {
                lVar10 = 0;
                uVar5 = x;
                do {
                  uVar2 = data[uVar8 + lVar10 * 2 + 2];
                  *(short *)((long)psVar4 + lVar10 + uVar12 * 2) =
                       (short)((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                               (uint)data[uVar8 + lVar10 * 2 + 1] * 0x96 +
                               (uint)data[uVar8 + lVar10 * 2] * 0x4d >> 8);
                  uVar5 = uVar5 - 1;
                  lVar10 = lVar10 + 2;
                } while (0 < (int)uVar5);
              }
              break;
            case 0x22:
              if (-1 < iVar1) {
                lVar10 = 0;
                uVar5 = x;
                do {
                  uVar2 = data[uVar8 + lVar10 + 2];
                  *(short *)((long)psVar4 + lVar10 + uVar12 * 2) =
                       (short)((uint)uVar2 * 2 + ((uint)uVar2 + (uint)uVar2 * 8) * 3 +
                               (uint)data[uVar8 + lVar10 + 1] * 0x96 +
                               (uint)data[uVar8 + lVar10] * 0x4d >> 8);
                  *(stbi__uint16 *)((long)psVar4 + lVar10 + uVar12 * 2 + 2) =
                       data[uVar8 + lVar10 + 3];
                  uVar5 = uVar5 - 1;
                  lVar10 = lVar10 + 4;
                } while (0 < (int)uVar5);
              }
              break;
            case 0x23:
              uVar5 = x;
              if (-1 < iVar1) {
                do {
                  *(undefined4 *)psVar11 = *(undefined4 *)puVar7;
                  psVar11[2] = puVar7[2];
                  puVar7 = puVar7 + 4;
                  psVar11 = psVar11 + 3;
                  uVar5 = uVar5 - 1;
                } while (0 < (int)uVar5);
              }
            }
          }
          uVar13 = uVar13 + 1;
          uVar12 = (ulong)((int)uVar12 + req_comp * x);
          uVar8 = (ulong)((int)uVar8 + x * img_n);
        } while (uVar13 != y);
      }
      free(data);
    }
  }
  return psVar4;
}

Assistant:

static stbi__uint16 *stbi__convert_format16(stbi__uint16 *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   stbi__uint16 *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (stbi__uint16 *) stbi__malloc(req_comp * x * y * 2);
   if (good == NULL) {
      STBI_FREE(data);
      return (stbi__uint16 *) stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      stbi__uint16 *src  = data + j * x * img_n   ;
      stbi__uint16 *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=0xffff;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=0xffff;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                     } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                     } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=0xffff;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = 0xffff; } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                       } break;
         default: STBI_ASSERT(0);
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}